

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,1ul>,std::array<int,0ul>,mp::SinId>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::SinId> *cfc,
               ItemNamer *vnam)

{
  Buffer<char> *pBVar1;
  char *pcVar2;
  size_t __n;
  size_t sVar3;
  ptrdiff_t _Num;
  ulong uVar4;
  array<int,_1UL> *__range2;
  char *str;
  
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  uVar4 = sVar3 + 3;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
    sVar3 = pBVar1->size_;
  }
  pcVar2 = pBVar1->ptr_;
  pcVar2[sVar3 + 2] = 'n';
  pcVar2 = pcVar2 + sVar3;
  pcVar2[0] = 'S';
  pcVar2[1] = 'i';
  pBVar1->size_ = uVar4;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = '(';
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = '[';
  pcVar2 = ItemNamer::at(vnam,(long)(cfc->args_)._M_elems[0]);
  __n = strlen(pcVar2);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar4 = pBVar1->size_ + __n;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
  }
  if (__n != 0) {
    memmove(pBVar1->ptr_ + pBVar1->size_,pcVar2,__n);
  }
  pBVar1->size_ = uVar4;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ']';
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  uVar4 = sVar3 + 2;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
    sVar3 = pBVar1->size_;
  }
  pcVar2 = pBVar1->ptr_;
  (pcVar2 + sVar3)[0] = ',';
  (pcVar2 + sVar3)[1] = ' ';
  pBVar1->size_ = uVar4;
  WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,0ul>,int>
            (wrt,(array<int,_0UL> *)&cfc->field_0x4);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ')';
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt,
    const CustomConstraintData<A,P,I>& cfc,
    ItemNamer& vnam) {
  wrt << cfc.GetTypeName();
  wrt << '(';
  WriteModelItem(wrt, cfc.GetArguments(), vnam);
  wrt << ", ";
  WriteModelItemParameters(wrt, cfc.GetParameters());
  wrt << ')';
}